

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

void __thiscall
Clasp::Asp::SccChecker::SccChecker
          (SccChecker *this,LogicProgram *prg,AtomList *sccAtoms,uint32 startScc)

{
  uint32 i;
  uint uVar1;
  
  (this->nodeStack_).ebo_.buf = (pointer)0x0;
  (this->nodeStack_).ebo_.size = 0;
  (this->nodeStack_).ebo_.cap = 0;
  (this->callStack_).ebo_.buf = (pointer)0x0;
  (this->callStack_).ebo_.size = 0;
  (this->callStack_).ebo_.cap = 0;
  this->prg_ = prg;
  this->sccAtoms_ = sccAtoms;
  this->count_ = 0;
  this->sccs_ = startScc;
  for (uVar1 = 0; uVar1 != (prg->atoms_).ebo_.size - 1; uVar1 = uVar1 + 1) {
    visit(this,(prg->atoms_).ebo_.buf[uVar1]);
  }
  for (uVar1 = 0; uVar1 != (prg->bodies_).ebo_.size; uVar1 = uVar1 + 1) {
    visit(this,(prg->bodies_).ebo_.buf[uVar1]);
  }
  return;
}

Assistant:

SccChecker::SccChecker(LogicProgram& prg, AtomList& sccAtoms, uint32 startScc)
	: prg_(&prg), sccAtoms_(&sccAtoms), count_(0), sccs_(startScc) {
	for (uint32 i = 0; i != prg.numAtoms(); ++i) {
		visit(prg.getAtom(i));
	}
	for (uint32 i = 0; i != prg.numBodies(); ++i) {
		visit(prg.getBody(i));
	}
}